

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall HashUtil_operator_Test::~HashUtil_operator_Test(HashUtil_operator_Test *this)

{
  HashUtil_operator_Test *this_local;
  
  ~HashUtil_operator_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(HashUtil, operator) {
  ByteData target(
      "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac");
  HashUtil hash_util(HashUtil::kSha512);
  hash_util << target.GetBytes();
  HashUtil hash_util2(HashUtil::kSha512);
  hash_util2 = hash_util;
  EXPECT_EQ(
      hash_util2.Output().GetHex(),
      "7ad6132c2611fd0496ad42c758edc1bc2a23c3a4c463e139e144e25c35a53765c4c4c99d68d821a1bdd71b10e88afebdba72bfa0ae3877f628f1e2eab5320229");
}